

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void __thiscall google::protobuf::MessageLite::LogInitializationErrorMessage(MessageLite *this)

{
  LogMessage *pLVar1;
  MessageLite *in_R8;
  string_view action;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string local_60;
  LogMessage local_28;
  Voidify local_11;
  MessageLite *local_10;
  MessageLite *this_local;
  
  local_10 = this;
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0xcd);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"parse");
  action._M_str = (char *)this;
  action._M_len = (size_t)local_70._M_str;
  protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
            (&local_60,(_anonymous_namespace_ *)local_70._M_len,action,in_R8);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_60);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar1);
  std::__cxx11::string::~string((string *)&local_60);
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_28);
  return;
}

Assistant:

void MessageLite::LogInitializationErrorMessage() const {
  ABSL_LOG(ERROR) << InitializationErrorMessage("parse", *this);
}